

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_global_motion_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  int iVar1;
  RK_S32 RVar2;
  RK_S32 idx;
  long lVar3;
  uint uVar4;
  AV1RawFrameHeader *current_00;
  long lVar5;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  char local_3c [4];
  char local_38 [4];
  char local_34 [4];
  
  if ((gb->field_0xc & 0xfd) != 0) {
    lVar5 = 0x2a5;
    lVar3 = 0x2d8;
    do {
      idx = 1;
      RVar2 = mpp_av1_read_unsigned(&ctx->gb,1,"is_global[ref]",(RK_U32 *)local_34,0,1);
      if (RVar2 < 0) {
        return -1;
      }
      *(char *)((long)gb + lVar5 + -0x10) = local_34[0];
      if (local_34[0] == '\0') {
        current_00 = (AV1RawFrameHeader *)0x0;
      }
      else {
        idx = 1;
        RVar2 = mpp_av1_read_unsigned(&ctx->gb,1,"is_rot_zoom[ref]",(RK_U32 *)local_38,0,1);
        if (RVar2 < 0) {
          return -1;
        }
        *(char *)((long)gb + lVar5 + -8) = local_38[0];
        current_00 = (AV1RawFrameHeader *)0x2;
        if (local_38[0] == '\0') {
          idx = 1;
          RVar2 = mpp_av1_read_unsigned(&ctx->gb,1,"is_translation[ref]",(RK_U32 *)local_3c,0,1);
          if (RVar2 < 0) {
            return -1;
          }
          *(char *)((long)&gb->data_ + lVar5) = local_3c[0];
          current_00 = (AV1RawFrameHeader *)(ulong)((uint)(local_3c[0] == '\0') * 2 + 1);
        }
      }
      uVar4 = (uint)current_00;
      iVar1 = (int)lVar5;
      if (1 < uVar4) {
        RVar2 = mpp_av1_global_motion_param(ctx,gb,current_00,iVar1 + -0x2a4,2,idx);
        if (RVar2 < 0) {
          return RVar2;
        }
        RVar2 = mpp_av1_global_motion_param(ctx,gb,current_00,iVar1 + -0x2a4,3,idx);
        if (RVar2 < 0) {
          return -1;
        }
        if (uVar4 == 3) {
          RVar2 = mpp_av1_global_motion_param(ctx,gb,(AV1RawFrameHeader *)0x3,iVar1 + -0x2a4,4,idx);
          if (RVar2 < 0) {
            return -1;
          }
          RVar2 = mpp_av1_global_motion_param(ctx,gb,(AV1RawFrameHeader *)0x3,iVar1 + -0x2a4,5,idx);
          if (RVar2 < 0) {
            return -1;
          }
        }
        else {
          *(int *)((long)gb + lVar3 + -4) = -*(int *)((long)gb + lVar3 + -8);
          *(undefined4 *)((long)&gb->data_ + lVar3) = *(undefined4 *)((long)gb + lVar3 + -0xc);
        }
      }
      if (uVar4 != 0) {
        RVar2 = mpp_av1_global_motion_param(ctx,gb,current_00,iVar1 + -0x2a4,0,idx);
        if (RVar2 < 0) {
          return RVar2;
        }
        RVar2 = mpp_av1_global_motion_param(ctx,gb,current_00,iVar1 + -0x2a4,1,idx);
        if (RVar2 < 0) {
          return -1;
        }
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x380);
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_global_motion_params(AV1Context *ctx, BitReadCtx_t *gb,
                                           AV1RawFrameHeader *current)
{
    RK_S32 ref, type;
    RK_S32 err;

    if (current->frame_type == AV1_FRAME_KEY ||
        current->frame_type == AV1_FRAME_INTRA_ONLY)
        return 0;

    for (ref = AV1_REF_FRAME_LAST; ref <= AV1_REF_FRAME_ALTREF; ref++) {
        flags(is_global[ref], 1, ref);
        if (current->is_global[ref]) {
            flags(is_rot_zoom[ref], 1, ref);
            if (current->is_rot_zoom[ref]) {
                type = AV1_WARP_MODEL_ROTZOOM;
            } else {
                flags(is_translation[ref], 1, ref);
                type = current->is_translation[ref] ? AV1_WARP_MODEL_TRANSLATION
                       : AV1_WARP_MODEL_AFFINE;
            }
        } else {
            type = AV1_WARP_MODEL_IDENTITY;
        }

        if (type >= AV1_WARP_MODEL_ROTZOOM) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 2));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 3));
            if (type == AV1_WARP_MODEL_AFFINE) {
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 4));
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 5));
            } else {
                current->gm_params[ref][4] =  -current->gm_params[ref][3];
                current->gm_params[ref][5] =   current->gm_params[ref][2];
            }
        }
        if (type >= AV1_WARP_MODEL_TRANSLATION) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 0));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 1));
        }
    }

    return 0;
}